

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O3

SpatialMatrix * __thiscall
RigidBodyDynamics::Math::SpatialTransform::toMatrixAdjoint
          (SpatialMatrix *__return_storage_ptr__,SpatialTransform *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  undefined8 uVar7;
  SrcEvaluatorType srcEvaluator;
  long lVar8;
  Matrix3d _Erx;
  SpatialTransform *local_b8;
  undefined8 *local_b0;
  Matrix3_t local_a8;
  undefined8 local_60 [2];
  undefined4 local_50;
  uint uStack_4c;
  undefined4 uStack_48;
  uint uStack_44;
  undefined8 local_40;
  double local_38;
  undefined4 local_30;
  uint uStack_2c;
  double local_28;
  undefined8 local_20;
  
  local_38 = (this->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
  lVar8 = 0;
  local_b0 = local_60;
  local_60[0] = 0;
  local_40 = 0;
  local_28 = -local_38;
  local_50 = *(undefined4 *)
              ((this->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
               .m_storage.m_data.array + 1);
  uStack_2c = *(uint *)((long)(this->r).super_Vector3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + 0xc);
  uStack_48 = *(undefined4 *)
               ((this->r).super_Vector3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               + 2);
  uStack_4c = uStack_2c ^ 0x80000000;
  uStack_44 = *(uint *)((long)(this->r).super_Vector3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + 0x14) ^ 0x80000000;
  local_20 = 0;
  local_b8 = this;
  local_30 = local_50;
  Matrix3_t::
  Matrix3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            (&local_a8,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_b8);
  do {
    puVar1 = (undefined8 *)
             ((long)(this->E).super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + lVar8);
    uVar7 = puVar1[1];
    puVar2 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar8 * 2);
    *puVar2 = *puVar1;
    puVar2[1] = uVar7;
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array +
     lVar8 * 2 + 0x10) =
         *(undefined8 *)
          ((long)(this->E).super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          + lVar8 + 0x10);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x48);
  lVar8 = 0;
  do {
    uVar4 = *(uint *)((long)local_a8.super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array + lVar8 + 4);
    uVar5 = *(undefined4 *)
             ((long)local_a8.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + lVar8 + 8);
    uVar6 = *(uint *)((long)local_a8.super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array + lVar8 + 0xc);
    puVar3 = (undefined4 *)
             ((long)(__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar8 * 2 + 0x90);
    *puVar3 = *(undefined4 *)
               ((long)local_a8.super_Matrix3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                      array + lVar8);
    puVar3[1] = uVar4 ^ 0x80000000;
    puVar3[2] = uVar5;
    puVar3[3] = uVar6 ^ 0x80000000;
    *(ulong *)((long)(__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array + lVar8 * 2 + 0xa0) =
         *(ulong *)((long)local_a8.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + lVar8 + 0x10) ^ 0x8000000000000000;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x48);
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
  lVar8 = 0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xf] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x10] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x11] = 0.0;
  do {
    puVar1 = (undefined8 *)
             ((long)(this->E).super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + lVar8);
    uVar7 = puVar1[1];
    puVar2 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar8 * 2 + 0xa8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar7;
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array +
     lVar8 * 2 + 0xb8) =
         *(undefined8 *)
          ((long)(this->E).super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          + lVar8 + 0x10);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x48);
  return __return_storage_ptr__;
}

Assistant:

SpatialMatrix toMatrixAdjoint () const {
		Matrix3d _Erx =
			E * Matrix3d (
					0., -r[2], r[1],
					r[2], 0., -r[0],
					-r[1], r[0], 0.
					);
		SpatialMatrix result;
		result.block<3,3>(0,0) = E;
		result.block<3,3>(0,3) = -_Erx;
		result.block<3,3>(3,0) = Matrix3d::Zero(3,3);
		result.block<3,3>(3,3) = E;

		return result;
	}